

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__encode_uint8_linear_BGRA(void *outputp,int width_times_channels,float *encode)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined8 *puVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  float fVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  undefined1 auVar20 [16];
  float *pfVar21;
  uchar *output;
  undefined8 *puVar22;
  undefined8 *puVar23;
  float *pfVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  auVar20 = _DAT_005ecd50;
  puVar4 = (undefined8 *)((long)outputp + (long)width_times_channels);
  if (width_times_channels < 8) {
    if (3 < width_times_channels) {
      puVar22 = (undefined8 *)((long)outputp + 4);
      do {
        auVar26._0_4_ = encode[2] + 0.5;
        auVar26._4_4_ = encode[1] + 0.5;
        auVar26._8_4_ = *encode + 0.5;
        auVar26._12_4_ = encode[3] + 0.5;
        auVar26 = minps(auVar26,auVar20);
        auVar26 = maxps(auVar26,ZEXT816(0));
        auVar29._0_4_ = (int)auVar26._0_4_;
        auVar29._4_4_ = (int)auVar26._4_4_;
        auVar29._8_4_ = (int)auVar26._8_4_;
        auVar29._12_4_ = (int)auVar26._12_4_;
        auVar26 = packssdw(auVar29,auVar29);
        sVar5 = auVar26._0_2_;
        sVar6 = auVar26._2_2_;
        sVar7 = auVar26._4_2_;
        sVar8 = auVar26._6_2_;
        *(uint *)((long)puVar22 + -4) =
             CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar26[6] - (0xff < sVar8),
                      CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar26[4] - (0xff < sVar7),
                               CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar26[2] - (0xff < sVar6),
                                        (0 < sVar5) * (sVar5 < 0x100) * auVar26[0] - (0xff < sVar5))
                              ));
        encode = encode + 4;
        puVar22 = (undefined8 *)((long)puVar22 + 4);
      } while (puVar22 <= puVar4);
    }
  }
  else {
    pfVar21 = encode + (long)width_times_channels + -8;
    puVar22 = puVar4 + -1;
    do {
      pfVar1 = encode + 8;
      puVar2 = (undefined8 *)((long)outputp + 8);
      puVar23 = puVar22;
      if (puVar2 == puVar4) {
        puVar23 = puVar2;
      }
      fVar13 = *encode;
      pfVar14 = encode + 1;
      pfVar15 = encode + 2;
      pfVar16 = encode + 3;
      pfVar24 = pfVar21;
      if (puVar2 == puVar4) {
        pfVar24 = pfVar1;
      }
      if (puVar2 <= puVar22) {
        puVar23 = puVar2;
      }
      pfVar3 = encode + 4;
      pfVar17 = encode + 5;
      pfVar18 = encode + 6;
      pfVar19 = encode + 7;
      encode = pfVar24;
      if (puVar2 <= puVar22) {
        encode = pfVar1;
      }
      auVar25._0_4_ = *pfVar15 + 0.5;
      auVar25._4_4_ = *pfVar14 + 0.5;
      auVar25._8_4_ = fVar13 + 0.5;
      auVar25._12_4_ = *pfVar16 + 0.5;
      auVar28._0_4_ = *pfVar18 + 0.5;
      auVar28._4_4_ = *pfVar17 + 0.5;
      auVar28._8_4_ = *pfVar3 + 0.5;
      auVar28._12_4_ = *pfVar19 + 0.5;
      auVar26 = minps(auVar25,auVar20);
      auVar29 = minps(auVar28,auVar20);
      auVar26 = maxps(auVar26,ZEXT816(0));
      auVar29 = maxps(auVar29,ZEXT816(0));
      auVar27._0_4_ = (int)auVar26._0_4_;
      auVar27._4_4_ = (int)auVar26._4_4_;
      auVar27._8_4_ = (int)auVar26._8_4_;
      auVar27._12_4_ = (int)auVar26._12_4_;
      auVar30._0_4_ = (int)auVar29._0_4_;
      auVar30._4_4_ = (int)auVar29._4_4_;
      auVar30._8_4_ = (int)auVar29._8_4_;
      auVar30._12_4_ = (int)auVar29._12_4_;
      auVar26 = packssdw(auVar27,auVar30);
      sVar5 = auVar26._0_2_;
      sVar6 = auVar26._2_2_;
      sVar7 = auVar26._4_2_;
      sVar8 = auVar26._6_2_;
      sVar9 = auVar26._8_2_;
      sVar10 = auVar26._10_2_;
      sVar11 = auVar26._12_2_;
      sVar12 = auVar26._14_2_;
      *(ulong *)outputp =
           CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar26[0xe] - (0xff < sVar12),
                    CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar26[0xc] - (0xff < sVar11),
                             CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar26[10] -
                                      (0xff < sVar10),
                                      CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar26[8] -
                                               (0xff < sVar9),
                                               CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar26[6] -
                                                        (0xff < sVar8),
                                                        CONCAT12((0 < sVar7) * (sVar7 < 0x100) *
                                                                 auVar26[4] - (0xff < sVar7),
                                                                 CONCAT11((0 < sVar6) *
                                                                          (sVar6 < 0x100) *
                                                                          auVar26[2] -
                                                                          (0xff < sVar6),
                                                                          (0 < sVar5) *
                                                                          (sVar5 < 0x100) *
                                                                          auVar26[0] -
                                                                          (0xff < sVar5))))))));
      outputp = puVar23;
    } while (puVar2 != puVar4);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_linear )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char *) outputp;
  unsigned char * end_output = ( (unsigned char *) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= stbir__simdfX_float_count*2 )
  {
    float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
    end_output -= stbir__simdfX_float_count*2;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdfX e0, e1;
      stbir__simdi i;
      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdfX_add_mem( e0, STBIR_simd_point5X, encode );
      stbir__simdfX_add_mem( e1, STBIR_simd_point5X, encode+stbir__simdfX_float_count );
      stbir__encode_simdfX_unflip( e0 );
      stbir__encode_simdfX_unflip( e1 );
      #ifdef STBIR_SIMD8
      stbir__simdf8_pack_to_16bytes( i, e0, e1 );
      stbir__simdi_store( output, i );
      #else
      stbir__simdf_pack_to_8bytes( i, e0, e1 );
      stbir__simdi_store2( output, i );
      #endif
      encode += stbir__simdfX_float_count*2;
      output += stbir__simdfX_float_count*2;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e0;
    stbir__simdi i0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e0, encode );
    stbir__simdf_add( e0, STBIR__CONSTF(STBIR_simd_point5), e0 );
    stbir__encode_simdf4_unflip( e0 );
    stbir__simdf_pack_to_8bytes( i0, e0, e0 );  // only use first 4
    *(int*)(output-4) = stbir__simdi_to_int( i0 );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  while( output <= end_output )
  {
    float f;
    f = encode[stbir__encode_order0] + 0.5f; STBIR_CLAMP(f, 0, 255); output[0-4] = (unsigned char)f;
    f = encode[stbir__encode_order1] + 0.5f; STBIR_CLAMP(f, 0, 255); output[1-4] = (unsigned char)f;
    f = encode[stbir__encode_order2] + 0.5f; STBIR_CLAMP(f, 0, 255); output[2-4] = (unsigned char)f;
    f = encode[stbir__encode_order3] + 0.5f; STBIR_CLAMP(f, 0, 255); output[3-4] = (unsigned char)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] + 0.5f; STBIR_CLAMP(f, 0, 255); output[0] = (unsigned char)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] + 0.5f; STBIR_CLAMP(f, 0, 255); output[1] = (unsigned char)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] + 0.5f; STBIR_CLAMP(f, 0, 255); output[2] = (unsigned char)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}